

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:670:58)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:670:58)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  long *plVar3;
  undefined8 *puVar4;
  global_object *this_00;
  object *poVar5;
  uint *puVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar7;
  undefined8 extraout_RDX_02;
  long lVar8;
  pointer pvVar9;
  value *pvVar10;
  gc_heap *this_01;
  uint32_t k;
  mjs *this_02;
  initializer_list<mjs::value> __l;
  initializer_list<mjs::value> __l_00;
  object_ptr o;
  wstring is;
  uint32_t len;
  value callback;
  value res;
  value kval;
  value this_arg;
  allocator_type local_1d9;
  gc_heap_ptr_untyped local_1d8;
  gc_heap_ptr_untyped local_1c8;
  undefined1 local_1b8 [36];
  uint32_t local_194;
  gc_heap_ptr_untyped local_190;
  value local_180;
  undefined4 local_158;
  double local_150;
  undefined4 local_130;
  gc_heap_ptr_untyped local_128 [2];
  value *local_108;
  anon_class_24_3_2ec80dac local_100;
  value local_e8;
  vector<mjs::value,_std::allocator<mjs::value>_> local_c0;
  value local_a8;
  value local_80;
  value local_58;
  
  local_108 = __return_storage_ptr__;
  make_array((gc_heap_ptr<mjs::global_object> *)&local_190,(int)this + 8);
  local_194 = 0;
  local_1c8.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  local_1c8.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  if (local_1c8.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_1c8.heap_,&local_1c8);
  }
  local_100.len = &local_194;
  local_100.this_ = this_;
  local_100.a = (object_ptr *)&local_190;
  plVar3 = (long *)gc_heap_ptr_untyped::get(&local_1c8);
  (**(code **)(*plVar3 + 0x88))(&local_1d8,plVar3,this_);
  puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1d8);
  local_e8.type_ = reference;
  local_e8._4_4_ = 0;
  local_e8.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x197438;
  (**(code **)*puVar4)(&local_180,puVar4);
  uVar2 = to_uint32(&local_180);
  value::destroy(&local_180);
  pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar9 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    pvVar9 = (pointer)&value::undefined;
  }
  value::value(&local_e8,pvVar9);
  this_00 = (global_object *)gc_heap_ptr_untyped::get(&local_1c8);
  plVar3 = (long *)gc_heap_ptr_untyped::get(&local_1c8);
  (**(code **)(*plVar3 + 0x60))(&local_180,plVar3);
  global_object::validate_type(this_00,&local_e8,(object_ptr *)&local_180,"function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_180);
  pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pvVar9 >> 3) * -0x3333333333333333) <
      2) {
    pvVar10 = (value *)&value::undefined;
  }
  else {
    pvVar10 = pvVar9 + 1;
  }
  value::value(&local_58,pvVar10);
  if (uVar2 < 0x10000) {
    if (uVar2 != 0) {
      this_02 = (mjs *)0x0;
      uVar7 = extraout_RDX;
      do {
        k = (uint32_t)this_02;
        index_string_abi_cxx11_((wstring *)local_1b8,this_02,(uint32_t)uVar7);
        poVar5 = (object *)gc_heap_ptr_untyped::get(&local_1d8);
        local_180._0_8_ = local_1b8._8_8_;
        local_180.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)local_1b8._0_8_;
        bVar1 = object::has_property(poVar5,(wstring_view *)&local_180);
        uVar7 = extraout_RDX_00;
        if (bVar1) {
          puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1d8);
          local_180._0_8_ = local_1b8._8_8_;
          local_180.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)local_1b8._0_8_;
          (**(code **)*puVar4)(&local_80,puVar4,&local_180);
          value::value(&local_180,&local_80);
          local_150 = (double)(int)k;
          local_158 = 3;
          local_130 = 5;
          local_128[0].heap_ = local_1d8.heap_;
          local_128[0].pos_ = local_1d8.pos_;
          if (local_1d8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1d8.heap_,local_128);
          }
          __l._M_len = 3;
          __l._M_array = &local_180;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l,&local_1d9);
          call_function(&local_a8,&local_e8,&local_58,&local_c0);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
          lVar8 = 0x50;
          do {
            value::destroy((value *)((long)&local_180.type_ + lVar8));
            lVar8 = lVar8 + -0x28;
          } while (lVar8 != -0x28);
          anon_unknown_110::array_filter::anon_class_24_3_2ec80dac::operator()
                    (&local_100,k,&local_a8);
          value::destroy(&local_a8);
          value::destroy(&local_80);
          uVar7 = extraout_RDX_01;
        }
        if ((gc_heap *)local_1b8._0_8_ != (gc_heap *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ * 4 + 4);
          uVar7 = extraout_RDX_02;
        }
        this_02 = (mjs *)(ulong)(k + 1);
      } while (k + 1 != uVar2);
    }
  }
  else {
    poVar5 = (object *)gc_heap_ptr_untyped::get(&local_1d8);
    object::enumerable_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_1b8,poVar5);
    if (local_1b8._0_8_ != local_1b8._8_8_) {
      this_01 = (gc_heap *)local_1b8._0_8_;
      do {
        puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
        local_180.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)(puVar6 + 1);
        local_180._0_8_ = ZEXT48(*puVar6);
        uVar2 = index_value_from_string((wstring_view *)&local_180);
        if (uVar2 != 0xffffffff) {
          puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1d8);
          puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
          local_180.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)(puVar6 + 1);
          local_180._0_8_ = ZEXT48(*puVar6);
          (**(code **)*puVar4)(&local_80,puVar4,&local_180);
          value::value(&local_180,&local_80);
          local_150 = (double)uVar2;
          local_158 = 3;
          local_130 = 5;
          local_128[0].heap_ = local_1d8.heap_;
          local_128[0].pos_ = local_1d8.pos_;
          if (local_1d8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1d8.heap_,local_128);
          }
          __l_00._M_len = 3;
          __l_00._M_array = &local_180;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l_00,&local_1d9);
          call_function(&local_a8,&local_e8,&local_58,&local_c0);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
          lVar8 = 0x50;
          do {
            value::destroy((value *)((long)&local_180.type_ + lVar8));
            lVar8 = lVar8 + -0x28;
          } while (lVar8 != -0x28);
          anon_unknown_110::array_filter::anon_class_24_3_2ec80dac::operator()
                    (&local_100,uVar2,&local_a8);
          value::destroy(&local_a8);
          value::destroy(&local_80);
        }
        this_01 = (gc_heap *)&this_01->alloc_context_;
      } while (this_01 != (gc_heap *)local_1b8._8_8_);
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_1b8);
  }
  value::destroy(&local_58);
  value::destroy(&local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1d8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1c8);
  pvVar10 = local_108;
  local_108->type_ = object;
  (local_108->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       local_190.heap_;
  *(uint32_t *)((long)&local_108->field_1 + 8) = local_190.pos_;
  if (local_190.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_190.heap_,(gc_heap_ptr_untyped *)&(local_108->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_190);
  return pvVar10;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }